

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommand.cxx
# Opt level: O0

cmLegacyCommandWrapper * __thiscall
cmLegacyCommandWrapper::operator=(cmLegacyCommandWrapper *this,cmLegacyCommandWrapper *other)

{
  pointer pcVar1;
  unique_ptr<cmCommand,_std::default_delete<cmCommand>_> local_20;
  cmLegacyCommandWrapper *local_18;
  cmLegacyCommandWrapper *other_local;
  cmLegacyCommandWrapper *this_local;
  
  local_18 = other;
  other_local = this;
  pcVar1 = std::unique_ptr<cmCommand,_std::default_delete<cmCommand>_>::operator->(&other->Command);
  (*pcVar1->_vptr_cmCommand[3])(&local_20);
  std::unique_ptr<cmCommand,_std::default_delete<cmCommand>_>::operator=(&this->Command,&local_20);
  std::unique_ptr<cmCommand,_std::default_delete<cmCommand>_>::~unique_ptr(&local_20);
  return this;
}

Assistant:

cmLegacyCommandWrapper& cmLegacyCommandWrapper::operator=(
  cmLegacyCommandWrapper const& other)
{
  this->Command = other.Command->Clone();
  return *this;
}